

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O0

spv_result_t spvtools::val::IdPass(ValidationState_t *_,Instruction *inst)

{
  spv_ext_inst_type_t ext_type;
  bool bVar1;
  Op OVar2;
  uint32_t key;
  uint uVar3;
  spv_result_t sVar4;
  spv_ext_inst_type_t *psVar5;
  ulong uVar6;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar7;
  DiagnosticStream *this_00;
  DiagnosticStream local_1208;
  undefined1 local_1029;
  bool must_have_forward_declared_ids;
  Instruction *def_1;
  undefined4 local_274;
  Op opcode;
  Instruction *def;
  spv_result_t ret;
  uint32_t operand_word;
  spv_operand_type_t *type;
  spv_parsed_operand_t *operand;
  byte local_45;
  uint i;
  undefined1 local_40 [3];
  bool has_forward_declared_ids;
  uint32_t result_id;
  function<bool_(unsigned_int)> can_have_forward_declared_ids;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  can_have_forward_declared_ids._M_invoker = (_Invoker_type)inst;
  OVar2 = Instruction::opcode(inst);
  bVar1 = spvIsExtendedInstruction(OVar2);
  if (bVar1) {
    psVar5 = Instruction::ext_inst_type((Instruction *)can_have_forward_declared_ids._M_invoker);
    bVar1 = spvExtInstIsDebugInfo(*psVar5);
    if (bVar1) {
      OVar2 = Instruction::opcode((Instruction *)can_have_forward_declared_ids._M_invoker);
      psVar5 = Instruction::ext_inst_type((Instruction *)can_have_forward_declared_ids._M_invoker);
      ext_type = *psVar5;
      key = Instruction::word((Instruction *)can_have_forward_declared_ids._M_invoker,4);
      spvDbgInfoExtOperandCanBeForwardDeclaredFunction
                ((function<bool_(unsigned_int)> *)local_40,OVar2,ext_type,key);
      goto LAB_0020465a;
    }
  }
  OVar2 = Instruction::opcode((Instruction *)can_have_forward_declared_ids._M_invoker);
  spvOperandCanBeForwardDeclaredFunction((function<bool_(unsigned_int)> *)local_40,OVar2);
LAB_0020465a:
  i = 0;
  local_45 = 0;
  operand._4_4_ = 0;
  while( true ) {
    uVar6 = (ulong)operand._4_4_;
    this = Instruction::operands((Instruction *)can_have_forward_declared_ids._M_invoker);
    sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    if (sVar7 <= uVar6) {
      OVar2 = Instruction::opcode((Instruction *)can_have_forward_declared_ids._M_invoker);
      local_1029 = OVar2 == OpExtInstWithForwardRefsKHR;
      if (((bool)local_1029) && ((local_45 & 1) == 0)) {
        ValidationState_t::diag
                  (&local_1208,_,SPV_ERROR_INVALID_ID,
                   (Instruction *)can_have_forward_declared_ids._M_invoker);
        this_00 = DiagnosticStream::operator<<
                            (&local_1208,
                             (char (*) [79])
                             "Opcode OpExtInstWithForwardRefsKHR must have at least one forward declared ID."
                            );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this_00);
        DiagnosticStream::~DiagnosticStream(&local_1208);
      }
      else {
        if (i != 0) {
          ValidationState_t::RemoveIfForwardDeclared(_,i);
        }
        __local._4_4_ = SPV_SUCCESS;
      }
      local_274 = 1;
      std::function<bool_(unsigned_int)>::~function((function<bool_(unsigned_int)> *)local_40);
      return __local._4_4_;
    }
    type = (spv_operand_type_t *)
           Instruction::operand
                     ((Instruction *)can_have_forward_declared_ids._M_invoker,(ulong)operand._4_4_);
    _ret = &((spv_parsed_operand_t *)type)->type;
    def._4_4_ = Instruction::word((Instruction *)can_have_forward_declared_ids._M_invoker,
                                  (ulong)((spv_parsed_operand_t *)type)->offset);
    def._0_4_ = 0xffffffff;
    uVar3 = *_ret - SPV_OPERAND_TYPE_ID;
    if (uVar3 < 6 || *_ret == SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER) break;
    def._0_4_ = 0;
    operand._4_4_ = operand._4_4_ + 1;
  }
  sVar4 = (*(code *)(&DAT_00575624 + *(int *)(&DAT_00575624 + (ulong)uVar3 * 4)))();
  return sVar4;
}

Assistant:

spv_result_t IdPass(ValidationState_t& _, Instruction* inst) {
  auto can_have_forward_declared_ids =
      spvIsExtendedInstruction(inst->opcode()) &&
              spvExtInstIsDebugInfo(inst->ext_inst_type())
          ? spvDbgInfoExtOperandCanBeForwardDeclaredFunction(
                inst->opcode(), inst->ext_inst_type(), inst->word(4))
          : spvOperandCanBeForwardDeclaredFunction(inst->opcode());

  // Keep track of a result id defined by this instruction.  0 means it
  // does not define an id.
  uint32_t result_id = 0;
  bool has_forward_declared_ids = false;

  for (unsigned i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    const spv_operand_type_t& type = operand.type;
    // We only care about Id operands, which are a single word.
    const uint32_t operand_word = inst->word(operand.offset);

    auto ret = SPV_ERROR_INTERNAL;
    switch (type) {
      case SPV_OPERAND_TYPE_RESULT_ID:
        // NOTE: Multiple Id definitions are being checked by the binary parser.
        //
        // Defer undefined-forward-reference removal until after we've analyzed
        // the remaining operands to this instruction.  Deferral only matters
        // for OpPhi since it's the only case where it defines its own forward
        // reference.  Other instructions that can have forward references
        // either don't define a value or the forward reference is to a function
        // Id (and hence defined outside of a function body).
        result_id = operand_word;
        // NOTE: The result Id is added (in RegisterInstruction) *after* all of
        // the other Ids have been checked to avoid premature use in the same
        // instruction.
        ret = SPV_SUCCESS;
        break;
      case SPV_OPERAND_TYPE_ID:
      case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      case SPV_OPERAND_TYPE_SCOPE_ID:
        if (const auto def = _.FindDef(operand_word)) {
          const auto opcode = inst->opcode();
          if (spvOpcodeGeneratesType(def->opcode()) &&
              !spvOpcodeGeneratesType(opcode) && !spvOpcodeIsDebug(opcode) &&
              !inst->IsDebugInfo() && !inst->IsNonSemantic() &&
              !spvOpcodeIsDecoration(opcode) && opcode != spv::Op::OpFunction &&
              opcode != spv::Op::OpSizeOf &&
              opcode != spv::Op::OpCooperativeMatrixLengthNV &&
              opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
              !spvOpcodeGeneratesUntypedPointer(opcode) &&
              opcode != spv::Op::OpUntypedArrayLengthKHR &&
              !(opcode == spv::Op::OpSpecConstantOp &&
                (spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthNV ||
                 spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " cannot be a type";
          } else if (def->type_id() == 0 && !spvOpcodeGeneratesType(opcode) &&
                     !spvOpcodeIsDebug(opcode) && !inst->IsDebugInfo() &&
                     !inst->IsNonSemantic() && !spvOpcodeIsDecoration(opcode) &&
                     !spvOpcodeIsBranch(opcode) && opcode != spv::Op::OpPhi &&
                     opcode != spv::Op::OpExtInst &&
                     opcode != spv::Op::OpExtInstWithForwardRefsKHR &&
                     opcode != spv::Op::OpExtInstImport &&
                     opcode != spv::Op::OpSelectionMerge &&
                     opcode != spv::Op::OpLoopMerge &&
                     opcode != spv::Op::OpFunction &&
                     opcode != spv::Op::OpSizeOf &&
                     opcode != spv::Op::OpCooperativeMatrixLengthNV &&
                     opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
                     !spvOpcodeGeneratesUntypedPointer(opcode) &&
                     opcode != spv::Op::OpUntypedArrayLengthKHR &&
                     !(opcode == spv::Op::OpSpecConstantOp &&
                       (spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthNV ||
                        spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " requires a type";
          } else if (def->IsNonSemantic() && !inst->IsNonSemantic()) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " in semantic instruction cannot be a non-semantic "
                      "instruction";
          } else {
            ret = SPV_SUCCESS;
          }
        } else if (can_have_forward_declared_ids(i)) {
          has_forward_declared_ids = true;
          if (spvOpcodeGeneratesType(inst->opcode()) &&
              !_.IsForwardPointer(operand_word)) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "Operand " << _.getIdName(operand_word)
                  << " requires a previous definition";
          } else {
            ret = _.ForwardDeclareId(operand_word);
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_TYPE_ID:
        if (_.IsDefinedId(operand_word)) {
          auto* def = _.FindDef(operand_word);
          if (!spvOpcodeGeneratesType(def->opcode())) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "ID " << _.getIdName(operand_word) << " is not a type id";
          } else {
            ret = SPV_SUCCESS;
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
        // Ideally, this check would live in validate_extensions.cpp. But since
        // forward references are only allowed on non-semantic instructions, and
        // ID validation is done first, we would fail with a "ID had not been
        // defined" error before we could give a more helpful message. For this
        // reason, this test is done here, so we can be more helpful to the
        // user.
        if (inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR &&
            !inst->IsNonSemantic())
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "OpExtInstWithForwardRefsKHR is only allowed with "
                    "non-semantic instructions.";
        ret = SPV_SUCCESS;
        break;
      default:
        ret = SPV_SUCCESS;
        break;
    }
    if (SPV_SUCCESS != ret) return ret;
  }
  const bool must_have_forward_declared_ids =
      inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR;
  if (must_have_forward_declared_ids && !has_forward_declared_ids) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Opcode OpExtInstWithForwardRefsKHR must have at least one "
              "forward "
              "declared ID.";
  }

  if (result_id) _.RemoveIfForwardDeclared(result_id);

  return SPV_SUCCESS;
}